

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void dump_mpp_frame_to_file(MppFrame frame,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  RK_U8 *pRVar7;
  undefined8 uVar8;
  RK_U8 *tmp_5;
  RK_U8 *base_y_9;
  RK_U32 i_9;
  RK_U8 *tmp_4;
  RK_U8 *base_y_8;
  RK_U32 i_8;
  RK_U8 *tmp_3;
  RK_U8 *base_y_7;
  RK_U32 i_7;
  RK_U8 *tmp_2;
  RK_U8 *base_y_6;
  RK_U32 i_6;
  RK_U8 *tmp_line_1;
  RK_U8 *base_c_5;
  RK_U8 *base_y_5;
  RK_U32 k_1;
  RK_U32 i_5;
  RK_U8 *tmp_v_1;
  RK_U8 *tmp_u_1;
  RK_U8 *tmp_1;
  RK_U8 *base_c_4;
  RK_U8 *base_y_4;
  RK_U32 j_1;
  RK_U32 i_4;
  RK_U8 *tmp_line;
  RK_U8 *base_c_3;
  RK_U8 *base_y_3;
  RK_U32 k;
  RK_U32 i_3;
  RK_U8 *base_c_2;
  RK_U8 *base_y_2;
  RK_U8 *pRStack_88;
  RK_U32 i_2;
  RK_U8 *base_c_1;
  RK_U8 *base_y_1;
  RK_U8 *pRStack_70;
  RK_U32 i_1;
  RK_U8 *tmp_v;
  RK_U8 *tmp_u;
  RK_U8 *tmp;
  RK_U8 *base_c;
  RK_U8 *base_y;
  RK_U32 j;
  RK_U32 i;
  RK_U8 *base;
  MppBuffer buffer;
  MppFrameFormat fmt;
  RK_U32 v_stride;
  RK_U32 h_stride;
  RK_U32 height;
  RK_U32 width;
  FILE *fp_local;
  MppFrame frame_local;
  
  if ((fp != (FILE *)0x0) && (frame != (MppFrame)0x0)) {
    uVar1 = mpp_frame_get_width(frame);
    uVar2 = mpp_frame_get_height(frame);
    uVar3 = mpp_frame_get_hor_stride(frame);
    iVar4 = mpp_frame_get_ver_stride(frame);
    buffer._4_4_ = mpp_frame_get_fmt(frame);
    lVar6 = mpp_frame_get_buffer(frame);
    if (lVar6 != 0) {
      tmp_5 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(lVar6,"dump_mpp_frame_to_file");
      if ((((buffer._4_4_ & 0xf0000) == 0x10000) && ((buffer._4_4_ & 0xfffff) < 0x10010)) &&
         ((buffer._4_4_ & 0x1000000) == 0x1000000)) {
        buffer._4_4_ = buffer._4_4_ & 0xfffff;
      }
      uVar5 = buffer._4_4_ & 0xfffff;
      if (uVar5 != 0) {
        if (uVar5 == 1) {
          tmp_line = tmp_5 + uVar3 * iVar4;
          pRVar7 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",(ulong)uVar1 << 1);
          if (pRVar7 == (RK_U8 *)0x0) {
            _mpp_log_l(4,"utils","tmp_line malloc fail",0);
            return;
          }
          base_c_3 = tmp_5;
          for (base_y_3._4_4_ = 0; base_y_3._4_4_ < uVar2; base_y_3._4_4_ = base_y_3._4_4_ + 1) {
            for (base_y_3._0_4_ = 0; (uint)base_y_3 < uVar1 + 7 >> 3;
                base_y_3._0_4_ = (uint)base_y_3 + 1) {
              rearrange_pix(pRVar7,base_c_3,(uint)base_y_3);
            }
            fwrite(pRVar7,(ulong)uVar1 << 1,1,(FILE *)fp);
            base_c_3 = base_c_3 + uVar3;
          }
          for (base_y_3._4_4_ = 0; base_y_3._4_4_ < uVar2 >> 1; base_y_3._4_4_ = base_y_3._4_4_ + 1)
          {
            for (base_y_3._0_4_ = 0; (uint)base_y_3 < uVar1 + 7 >> 3;
                base_y_3._0_4_ = (uint)base_y_3 + 1) {
              rearrange_pix(pRVar7,tmp_line,(uint)base_y_3);
            }
            fwrite(pRVar7,(ulong)uVar1 << 1,1,(FILE *)fp);
            tmp_line = tmp_line + uVar3;
          }
          if (pRVar7 == (RK_U8 *)0x0) {
            return;
          }
          mpp_osal_free("dump_mpp_frame_to_file",pRVar7);
          return;
        }
        if (uVar5 == 2) {
          tmp = tmp_5 + uVar3 * iVar4;
          pRVar7 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar3 * uVar2 * 2);
          pRStack_70 = pRVar7 + (uVar1 * uVar2 >> 1);
          base_c = tmp_5;
          for (base_y._4_4_ = 0; base_y._4_4_ < uVar2; base_y._4_4_ = base_y._4_4_ + 1) {
            fwrite(base_c,1,(ulong)uVar1,(FILE *)fp);
            base_c = base_c + uVar3;
          }
          tmp_v = pRVar7;
          for (base_y._4_4_ = 0; base_y._4_4_ < uVar2; base_y._4_4_ = base_y._4_4_ + 1) {
            for (base_y._0_4_ = 0; (uint)base_y < uVar1 >> 1; base_y._0_4_ = (uint)base_y + 1) {
              tmp_v[(uint)base_y] = tmp[(uint)base_y << 1];
              pRStack_70[(uint)base_y] = tmp[(uint)base_y * 2 + 1];
            }
            tmp_v = tmp_v + (uVar1 >> 1);
            pRStack_70 = pRStack_70 + (uVar1 >> 1);
            tmp = tmp + uVar3;
          }
          fwrite(pRVar7,1,(ulong)(uVar1 * uVar2),(FILE *)fp);
          mpp_osal_free("dump_mpp_frame_to_file",pRVar7);
          return;
        }
        if (uVar5 == 4) {
          _k = tmp_5 + uVar3 * iVar4;
          base_c_2 = tmp_5;
          for (base_y_2._4_4_ = 0; base_y_2._4_4_ < uVar2; base_y_2._4_4_ = base_y_2._4_4_ + 1) {
            fwrite(base_c_2,1,(ulong)uVar1,(FILE *)fp);
            base_c_2 = base_c_2 + uVar3;
          }
          for (base_y_2._4_4_ = 0; base_y_2._4_4_ < uVar2 >> 1; base_y_2._4_4_ = base_y_2._4_4_ + 1)
          {
            fwrite(_k,1,(ulong)(uVar1 >> 1),(FILE *)fp);
            _k = _k + (uVar3 >> 1);
          }
          for (base_y_2._4_4_ = 0; base_y_2._4_4_ < uVar2 >> 1; base_y_2._4_4_ = base_y_2._4_4_ + 1)
          {
            fwrite(_k,1,(ulong)(uVar1 >> 1),(FILE *)fp);
            _k = _k + (uVar3 >> 1);
          }
          return;
        }
        if (uVar5 != 5) {
          if (3 < uVar5 - 8) {
            if (uVar5 == 0xc) {
              uVar8 = mpp_osal_malloc("dump_mpp_frame_to_file",uVar3 * uVar2);
              tmp_2 = tmp_5;
              for (base_y_6._4_4_ = 0; base_y_6._4_4_ < uVar2; base_y_6._4_4_ = base_y_6._4_4_ + 1)
              {
                fwrite(tmp_2,1,(ulong)uVar1,(FILE *)fp);
                tmp_2 = tmp_2 + uVar3;
              }
              mpp_osal_free("dump_mpp_frame_to_file",uVar8);
              return;
            }
            if (uVar5 == 0xf) {
              tmp_1 = tmp_5 + uVar3 * iVar4;
              pRVar7 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar3 * uVar2 * 2);
              _k_1 = pRVar7 + uVar1 * uVar2;
              base_c_4 = tmp_5;
              for (base_y_4._4_4_ = 0; base_y_4._4_4_ < uVar2; base_y_4._4_4_ = base_y_4._4_4_ + 1)
              {
                fwrite(base_c_4,1,(ulong)uVar1,(FILE *)fp);
                base_c_4 = base_c_4 + uVar3;
              }
              tmp_v_1 = pRVar7;
              for (base_y_4._4_4_ = 0; base_y_4._4_4_ < uVar2; base_y_4._4_4_ = base_y_4._4_4_ + 1)
              {
                for (base_y_4._0_4_ = 0; (uint)base_y_4 < uVar1; base_y_4._0_4_ = (uint)base_y_4 + 1
                    ) {
                  tmp_v_1[(uint)base_y_4] = tmp_1[(uint)base_y_4 << 1];
                  _k_1[(uint)base_y_4] = tmp_1[(uint)base_y_4 * 2 + 1];
                }
                tmp_v_1 = tmp_v_1 + uVar1;
                _k_1 = _k_1 + uVar1;
                tmp_1 = tmp_1 + (uVar3 << 1);
              }
              fwrite(pRVar7,1,(ulong)(uVar1 * uVar2 * 2),(FILE *)fp);
              mpp_osal_free("dump_mpp_frame_to_file",pRVar7);
              return;
            }
            if (uVar5 == 0x11) {
              tmp_line_1 = tmp_5 + uVar3 * iVar4;
              pRVar7 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",(ulong)uVar1 << 1);
              if (pRVar7 == (RK_U8 *)0x0) {
                _mpp_log_l(4,"utils","tmp_line malloc fail",0);
                return;
              }
              base_c_5 = tmp_5;
              for (base_y_5._4_4_ = 0; base_y_5._4_4_ < uVar2; base_y_5._4_4_ = base_y_5._4_4_ + 1)
              {
                for (base_y_5._0_4_ = 0; (uint)base_y_5 < uVar1 + 7 >> 3;
                    base_y_5._0_4_ = (uint)base_y_5 + 1) {
                  rearrange_pix(pRVar7,base_c_5,(uint)base_y_5);
                }
                fwrite(pRVar7,(ulong)uVar1 << 1,1,(FILE *)fp);
                base_c_5 = base_c_5 + uVar3;
              }
              for (base_y_5._4_4_ = 0; base_y_5._4_4_ < uVar2 << 1;
                  base_y_5._4_4_ = base_y_5._4_4_ + 1) {
                for (base_y_5._0_4_ = 0; (uint)base_y_5 < uVar1 + 7 >> 3;
                    base_y_5._0_4_ = (uint)base_y_5 + 1) {
                  rearrange_pix(pRVar7,tmp_line_1,(uint)base_y_5);
                }
                fwrite(pRVar7,(ulong)uVar1 << 1,1,(FILE *)fp);
                tmp_line_1 = tmp_line_1 + uVar3;
              }
              if (pRVar7 == (RK_U8 *)0x0) {
                return;
              }
              mpp_osal_free("dump_mpp_frame_to_file",pRVar7);
              return;
            }
            if (5 < uVar5 - 0x10000) {
              if (uVar5 == 0x10006) {
                uVar8 = mpp_osal_malloc("dump_mpp_frame_to_file",uVar1 * uVar2 * 3);
                for (base_y_9._4_4_ = 0; base_y_9._4_4_ < uVar2; base_y_9._4_4_ = base_y_9._4_4_ + 1
                    ) {
                  fwrite(tmp_5,1,(ulong)(uVar1 * 3),(FILE *)fp);
                  tmp_5 = tmp_5 + uVar3;
                }
                mpp_osal_free("dump_mpp_frame_to_file",uVar8);
                return;
              }
              if (3 < uVar5 - 0x1000a) {
                _mpp_log_l(2,"utils","not supported format %d\n",0,buffer._4_4_);
                return;
              }
              uVar8 = mpp_osal_malloc("dump_mpp_frame_to_file",uVar1 * uVar2 * 4);
              tmp_3 = tmp_5;
              for (base_y_7._4_4_ = 0; base_y_7._4_4_ < uVar2; base_y_7._4_4_ = base_y_7._4_4_ + 1)
              {
                fwrite(tmp_3,1,(ulong)(uVar1 << 2),(FILE *)fp);
                tmp_3 = tmp_3 + uVar3;
              }
              mpp_osal_free("dump_mpp_frame_to_file",uVar8);
              return;
            }
          }
          uVar8 = mpp_osal_malloc("dump_mpp_frame_to_file",uVar1 * uVar2 * 2);
          tmp_4 = tmp_5;
          for (base_y_8._4_4_ = 0; base_y_8._4_4_ < uVar2; base_y_8._4_4_ = base_y_8._4_4_ + 1) {
            fwrite(tmp_4,1,(ulong)(uVar1 << 1),(FILE *)fp);
            tmp_4 = tmp_4 + uVar3;
          }
          mpp_osal_free("dump_mpp_frame_to_file",uVar8);
          return;
        }
      }
      pRStack_88 = tmp_5 + uVar3 * iVar4;
      base_c_1 = tmp_5;
      for (base_y_1._4_4_ = 0; base_y_1._4_4_ < uVar2; base_y_1._4_4_ = base_y_1._4_4_ + 1) {
        fwrite(base_c_1,1,(ulong)uVar1,(FILE *)fp);
        base_c_1 = base_c_1 + uVar3;
      }
      for (base_y_1._4_4_ = 0; base_y_1._4_4_ < uVar2 >> 1; base_y_1._4_4_ = base_y_1._4_4_ + 1) {
        fwrite(pRStack_88,1,(ulong)uVar1,(FILE *)fp);
        pRStack_88 = pRStack_88 + uVar3;
      }
    }
  }
  return;
}

Assistant:

void dump_mpp_frame_to_file(MppFrame frame, FILE *fp)
{
    RK_U32 width    = 0;
    RK_U32 height   = 0;
    RK_U32 h_stride = 0;
    RK_U32 v_stride = 0;
    MppFrameFormat fmt  = MPP_FMT_YUV420SP;
    MppBuffer buffer    = NULL;
    RK_U8 *base = NULL;

    if (NULL == fp || NULL == frame)
        return ;

    width    = mpp_frame_get_width(frame);
    height   = mpp_frame_get_height(frame);
    h_stride = mpp_frame_get_hor_stride(frame);
    v_stride = mpp_frame_get_ver_stride(frame);
    fmt      = mpp_frame_get_fmt(frame);
    buffer   = mpp_frame_get_buffer(frame);

    if (NULL == buffer)
        return ;

    base = (RK_U8 *)mpp_buffer_get_ptr(buffer);

    if (MPP_FRAME_FMT_IS_RGB(fmt) && MPP_FRAME_FMT_IS_LE(fmt)) {
        fmt &= MPP_FRAME_FMT_MASK;
    }
    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV422SP : {
        /* YUV422SP -> YUV422P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height / 2;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride) {
            for (j = 0; j < width / 2; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width / 2;
            tmp_v += width / 2;
        }

        fwrite(tmp, 1, width * height, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV420SP_VU :
    case MPP_FMT_YUV420SP : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            fwrite(base_c, 1, width, fp);
        }
    } break;
    case MPP_FMT_YUV420P : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
    } break;
    case MPP_FMT_YUV420SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV444SP : {
        /* YUV444SP -> YUV444P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride * 2) {
            for (j = 0; j < width; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width;
            tmp_v += width;
        }

        fwrite(tmp, 1, width * height * 2, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV444SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < (height * 2); i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV400: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_ARGB8888:
    case MPP_FMT_ABGR8888:
    case MPP_FMT_BGRA8888:
    case MPP_FMT_RGBA8888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 4);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 4, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV422_YUYV:
    case MPP_FMT_YUV422_YVYU:
    case MPP_FMT_YUV422_UYVY:
    case MPP_FMT_YUV422_VYUY:
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555:
    case MPP_FMT_RGB444:
    case MPP_FMT_BGR444: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 2);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 2, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_RGB888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 3);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 3, fp);

        mpp_free(tmp);
    } break;
    default : {
        mpp_err("not supported format %d\n", fmt);
    } break;
    }
}